

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_verify.cpp
# Opt level: O1

pair<int,_long>
CalculateSequenceLocks
          (CTransaction *tx,int flags,vector<int,_std::allocator<int>_> *prevHeights,
          CBlockIndex *block)

{
  pointer piVar1;
  uint uVar2;
  CBlockIndex **ppCVar3;
  int64_t iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  pointer pCVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  pair<int,_long> pVar12;
  CBlockIndex *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)(prevHeights->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(prevHeights->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2 !=
      ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5) {
    __assert_fail("prevHeights.size() == tx.vin.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/consensus/tx_verify.cpp"
                  ,0x29,
                  "std::pair<int, int64_t> CalculateSequenceLocks(const CTransaction &, int, std::vector<int> &, const CBlockIndex &)"
                 );
  }
  lVar6 = -1;
  uVar9 = 0xffffffff;
  if ((((flags & 1U) != 0) && (1 < tx->version)) &&
     (pCVar10 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start,
     (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_finish != pCVar10)) {
    lVar7 = 0x12;
    uVar11 = 0;
    do {
      uVar2 = *(uint *)((pCVar10->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                       lVar7 * 4);
      piVar1 = (prevHeights->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((int)uVar2 < 0) {
        piVar1[uVar11] = 0;
      }
      else {
        iVar8 = piVar1[uVar11];
        if ((uVar2 >> 0x16 & 1) == 0) {
          uVar2 = ((uVar2 & 0xffff) + iVar8) - 1;
          if ((int)uVar9 <= (int)uVar2) {
            uVar9 = (ulong)uVar2;
          }
        }
        else {
          if (iVar8 < 2) {
            iVar8 = 1;
          }
          local_40 = CBlockIndex::GetAncestor(block,iVar8 + -1);
          ppCVar3 = inline_assertion_check<true,CBlockIndex_const*>
                              (&local_40,
                               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/consensus/tx_verify.cpp"
                               ,0x4a,"CalculateSequenceLocks",
                               "block.GetAncestor(std::max(nCoinHeight - 1, 0))");
          iVar4 = CBlockIndex::GetMedianTimePast(*ppCVar3);
          lVar5 = iVar4 + (ulong)((*(uint *)((pCVar10->prevout).hash.m_wrapped.super_base_blob<256U>
                                             .m_data._M_elems + lVar7 * 4) & 0xffff) << 9) + -1;
          if (lVar6 <= lVar5) {
            lVar6 = lVar5;
          }
        }
      }
      uVar11 = uVar11 + 1;
      pCVar10 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x1a;
    } while (uVar11 < (ulong)(((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pCVar10 >> 3)
                             * 0x4ec4ec4ec4ec4ec5));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  pVar12.second = lVar6;
  pVar12._0_8_ = uVar9;
  return pVar12;
}

Assistant:

std::pair<int, int64_t> CalculateSequenceLocks(const CTransaction &tx, int flags, std::vector<int>& prevHeights, const CBlockIndex& block)
{
    assert(prevHeights.size() == tx.vin.size());

    // Will be set to the equivalent height- and time-based nLockTime
    // values that would be necessary to satisfy all relative lock-
    // time constraints given our view of block chain history.
    // The semantics of nLockTime are the last invalid height/time, so
    // use -1 to have the effect of any height or time being valid.
    int nMinHeight = -1;
    int64_t nMinTime = -1;

    bool fEnforceBIP68 = tx.version >= 2 && flags & LOCKTIME_VERIFY_SEQUENCE;

    // Do not enforce sequence numbers as a relative lock time
    // unless we have been instructed to
    if (!fEnforceBIP68) {
        return std::make_pair(nMinHeight, nMinTime);
    }

    for (size_t txinIndex = 0; txinIndex < tx.vin.size(); txinIndex++) {
        const CTxIn& txin = tx.vin[txinIndex];

        // Sequence numbers with the most significant bit set are not
        // treated as relative lock-times, nor are they given any
        // consensus-enforced meaning at this point.
        if (txin.nSequence & CTxIn::SEQUENCE_LOCKTIME_DISABLE_FLAG) {
            // The height of this input is not relevant for sequence locks
            prevHeights[txinIndex] = 0;
            continue;
        }

        int nCoinHeight = prevHeights[txinIndex];

        if (txin.nSequence & CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG) {
            const int64_t nCoinTime{Assert(block.GetAncestor(std::max(nCoinHeight - 1, 0)))->GetMedianTimePast()};
            // NOTE: Subtract 1 to maintain nLockTime semantics
            // BIP 68 relative lock times have the semantics of calculating
            // the first block or time at which the transaction would be
            // valid. When calculating the effective block time or height
            // for the entire transaction, we switch to using the
            // semantics of nLockTime which is the last invalid block
            // time or height.  Thus we subtract 1 from the calculated
            // time or height.

            // Time-based relative lock-times are measured from the
            // smallest allowed timestamp of the block containing the
            // txout being spent, which is the median time past of the
            // block prior.
            nMinTime = std::max(nMinTime, nCoinTime + (int64_t)((txin.nSequence & CTxIn::SEQUENCE_LOCKTIME_MASK) << CTxIn::SEQUENCE_LOCKTIME_GRANULARITY) - 1);
        } else {
            nMinHeight = std::max(nMinHeight, nCoinHeight + (int)(txin.nSequence & CTxIn::SEQUENCE_LOCKTIME_MASK) - 1);
        }
    }

    return std::make_pair(nMinHeight, nMinTime);
}